

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void sarima_setOptMethod(sarima_object obj,int value)

{
  switch(value) {
  case 0:
    obj->optmethod = 0;
    return;
  case 1:
    obj->optmethod = 1;
    return;
  case 2:
    obj->optmethod = 2;
    return;
  case 3:
    obj->optmethod = 3;
    return;
  case 4:
    obj->optmethod = 4;
    return;
  case 5:
    obj->optmethod = 5;
    return;
  case 6:
    obj->optmethod = 6;
    return;
  case 7:
    obj->optmethod = 7;
    return;
  default:
    puts("\n Acceptable Numerical Values 0,1,2,3,4,5,6,7 ");
    puts("\n Method 0 - Nelder-Mead ");
    puts("\n Method 1 - Newton Line Search ");
    puts("\n Method 2 - Newton Trust Region - Hook Step ");
    puts("\n Method 3 - Newton Trust Region - Double Dog-Leg ");
    puts("\n Method 4 - Conjugate Gradient ");
    puts("\n Method 5 - BFGS ");
    puts("\n Method 6 - Limited Memory BFGS ");
    puts("\n Method 7 - BFGS More-Thuente Line Search ");
    return;
  }
}

Assistant:

void sarima_setOptMethod(sarima_object obj, int value) {
	/*
	* Method 0 - Nelder-Mead
	* Method 1 - Newton Line Search
	* Method 2 - Newton Trust Region - Hook Step
	* Method 3 - Newton Trust Region - Double Dog-Leg
	* Method 4 - Conjugate Gradient
	* Method 5 - BFGS
	* Method 6 - Limited Memory BFGS
	* Method 7 - BFGS More-Thuente Line Search
	*/
	if (value == 0) {
		obj->optmethod = 0;
	}
	else if (value == 1) {
		obj->optmethod = 1;
	}
	else if (value == 2) {
		obj->optmethod = 2;
	}
	else if (value == 3) {
		obj->optmethod = 3;
	}
	else if (value == 4) {
		obj->optmethod = 4;
	}
	else if (value == 5) {
		obj->optmethod = 5;
	}
	else if (value == 6) {
		obj->optmethod = 6;
	}
	else if (value == 7) {
		obj->optmethod = 7;
	}
	else {
		printf("\n Acceptable Numerical Values 0,1,2,3,4,5,6,7 \n");
		printf("\n Method 0 - Nelder-Mead \n");
		printf("\n Method 1 - Newton Line Search \n");
		printf("\n Method 2 - Newton Trust Region - Hook Step \n");
		printf("\n Method 3 - Newton Trust Region - Double Dog-Leg \n");
		printf("\n Method 4 - Conjugate Gradient \n");
		printf("\n Method 5 - BFGS \n");
		printf("\n Method 6 - Limited Memory BFGS \n");
		printf("\n Method 7 - BFGS More-Thuente Line Search \n");
	}
}